

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void crnlib::vector<crnlib::find_files::file_desc>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  long lVar1;
  
  for (lVar1 = (ulong)num * 0x48; lVar1 != 0; lVar1 = lVar1 + -0x48) {
    find_files::file_desc::file_desc((file_desc *)pDst_void,(file_desc *)pSrc_void);
    find_files::file_desc::~file_desc((file_desc *)pSrc_void);
    pSrc_void = (void *)((long)pSrc_void + 0x48);
    pDst_void = (void *)((long)pDst_void + 0x48);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }